

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O0

CURLcode Curl_md4it(uchar *output,uchar *input,size_t len)

{
  int iVar1;
  uint uVar2;
  undefined1 local_c0 [8];
  MD4_CTX ctx;
  size_t len_local;
  uchar *input_local;
  uchar *output_local;
  
  ctx.block._56_8_ = len;
  iVar1 = MD4_Init((MD4_CTX *)local_c0);
  if (iVar1 == 0) {
    output_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    uVar2 = curlx_uztoui(ctx.block._56_8_);
    MD4_Update((MD4_CTX *)local_c0,input,(ulong)uVar2);
    MD4_Final(output,(MD4_CTX *)local_c0);
    output_local._4_4_ = CURLE_OK;
  }
  return output_local._4_4_;
}

Assistant:

CURLcode Curl_md4it(unsigned char *output, const unsigned char *input,
                    const size_t len)
{
  MD4_CTX ctx;

#ifdef VOID_MD4_INIT
  MD4_Init(&ctx);
#else
  if(!MD4_Init(&ctx))
    return CURLE_FAILED_INIT;
#endif

  MD4_Update(&ctx, input, curlx_uztoui(len));
  MD4_Final(output, &ctx);
  return CURLE_OK;
}